

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# genrsa.cc
# Opt level: O3

bool GenerateRSAKey(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *args)

{
  bool bVar1;
  int iVar2;
  BIGNUM *a;
  UniquePtr<BIO> bio;
  UniquePtr<BIGNUM> e;
  uint bits;
  UniquePtr<RSA> rsa;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  args_map;
  _Head_base<0UL,_bio_st_*,_false> local_78;
  _Head_base<0UL,_bignum_st_*,_false> local_70;
  uint local_64;
  undefined1 local_60 [32];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_40;
  
  local_40._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_40._M_impl.super__Rb_tree_header._M_header;
  local_40._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_40._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_40._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_40._M_impl.super__Rb_tree_header._M_header._M_right =
       local_40._M_impl.super__Rb_tree_header._M_header._M_left;
  bVar1 = ParseKeyValueArguments
                    ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)&local_40,args,kArguments);
  if (bVar1) {
    local_60._0_8_ = (RSA *)(local_60 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"-bits","");
    bVar1 = GetUnsigned(&local_64,(string *)local_60,0x800,
                        (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_40);
    if ((RSA *)local_60._0_8_ != (RSA *)(local_60 + 0x10)) {
      operator_delete((void *)local_60._0_8_,local_60._16_8_ + 1);
    }
    if (bVar1) {
      local_60._0_8_ = RSA_new();
      a = BN_new();
      local_70._M_head_impl = (bignum_st *)a;
      local_78._M_head_impl = (bio_st *)BIO_new_fp(_stdout,0);
      iVar2 = BN_set_word(a,0x10001);
      if (iVar2 == 0) {
LAB_00126005:
        ERR_print_errors_fp(_stderr);
        bVar1 = false;
      }
      else {
        iVar2 = RSA_generate_key_ex((RSA *)local_60._0_8_,local_64,(BIGNUM *)local_70._M_head_impl,
                                    (BN_GENCB *)0x0);
        if (iVar2 == 0) goto LAB_00126005;
        iVar2 = PEM_write_bio_RSAPrivateKey
                          ((BIO *)local_78._M_head_impl,(RSA *)local_60._0_8_,(EVP_CIPHER *)0x0,
                           (uchar *)0x0,0,(undefined1 *)0x0,(void *)0x0);
        bVar1 = true;
        if (iVar2 == 0) goto LAB_00126005;
      }
      std::unique_ptr<bio_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<bio_st,_bssl::internal::Deleter> *)&local_78);
      std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&local_70);
      std::unique_ptr<rsa_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<rsa_st,_bssl::internal::Deleter> *)local_60);
      goto LAB_00126052;
    }
    PrintUsage(kArguments);
  }
  else {
    PrintUsage(kArguments);
  }
  bVar1 = false;
LAB_00126052:
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_40);
  return bVar1;
}

Assistant:

bool GenerateRSAKey(const std::vector<std::string> &args) {
  std::map<std::string, std::string> args_map;

  if (!ParseKeyValueArguments(&args_map, args, kArguments)) {
    PrintUsage(kArguments);
    return false;
  }

  unsigned bits;
  if (!GetUnsigned(&bits, "-bits", 2048, args_map)) {
    PrintUsage(kArguments);
    return false;
  }

  bssl::UniquePtr<RSA> rsa(RSA_new());
  bssl::UniquePtr<BIGNUM> e(BN_new());
  bssl::UniquePtr<BIO> bio(BIO_new_fp(stdout, BIO_NOCLOSE));

  if (!BN_set_word(e.get(), RSA_F4) ||
      !RSA_generate_key_ex(rsa.get(), bits, e.get(), NULL) ||
      !PEM_write_bio_RSAPrivateKey(bio.get(), rsa.get(), NULL /* cipher */,
                                   NULL /* key */, 0 /* key len */,
                                   NULL /* password callback */,
                                   NULL /* callback arg */)) {
    ERR_print_errors_fp(stderr);
    return false;
  }

  return true;
}